

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O3

newtRef NsLoadBinary(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  char *__filename;
  FILE *__stream;
  size_t __size;
  uint8_t *data;
  newtRef nVar2;
  int32_t err;
  
  _Var1 = NewtRefIsString(r);
  if (_Var1) {
    __filename = (char *)NewtRefToData(r);
    __stream = fopen(__filename,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      fseek(__stream,0,0);
      data = (uint8_t *)malloc(__size);
      fread(data,__size,1,__stream);
      fclose(__stream);
      nVar2 = NewtMakeSymbol("data");
      nVar2 = NewtMakeBinary(nVar2,data,(uint32_t)__size,false);
      return nVar2;
    }
    err = -49000;
  }
  else {
    err = -0xbd12;
  }
  nVar2 = NewtThrow(err,r);
  return nVar2;
}

Assistant:

newtRef NsLoadBinary(newtRefArg rcvr, newtRefArg r)
{
    if (NewtRefIsString(r)) {
        char *filename = NewtRefToString(r);
        FILE *f = fopen(filename, "rb");
        if (!f)
            return NewtThrow(kNErrFileNotFound, r);
        fseek(f, 0, SEEK_END);
        size_t size = ftell(f);
        fseek(f, 0, SEEK_SET);
        uint8_t *data = (uint8_t*)malloc(size);
        /*int err = (int)*/ fread(data, size, 1, f);
        fclose(f);
        return NewtMakeBinary(NSSYM(data), data, (uint32_t)size, false);
    } else {
        return NewtThrow(kNErrNotAString, r);
    }
}